

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char> __thiscall
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>
          (detail *this,basic_appender<char> out,unsigned___int128 value,uint prefix,
          format_specs *specs,digit_grouping<char> *grouping)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 n [16];
  undefined1 value_00 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  byte *pbVar8;
  basic_appender<char> bVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 in_register_00000014;
  byte *pbVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  undefined8 *in_R9;
  size_t sVar17;
  size_t n_00;
  bool bVar18;
  bool bVar19;
  memory_buffer buffer;
  undefined4 in_stack_fffffffffffffd28;
  anon_class_24_3_e2c60416 local_2c8 [5];
  memory_buffer local_248;
  
  uVar12 = CONCAT44(in_register_00000014,prefix);
  uVar15 = (uint)specs;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar6 = *(uint *)&(grouping->grouping_)._M_dataplus._M_p;
  switch(uVar6 & 7) {
  case 4:
    if ((uVar6 >> 0xd & 1) != 0) {
      uVar4 = (uint)((uVar6 >> 0xc & 1) == 0) << 0xd | 0x5830;
      uVar5 = uVar4 << 8;
      if (uVar15 == 0) {
        uVar5 = uVar4;
      }
      uVar15 = (uVar5 | uVar15) + 0x2000000;
    }
    uVar11 = uVar12;
    bVar9.container = out.container;
    n_00 = 0;
    do {
      sVar17 = n_00;
      uVar2 = uVar11 << 0x3c;
      n_00 = sVar17 + 1;
      bVar18 = (buffer<char> *)0xf < bVar9.container;
      bVar19 = uVar11 != 0;
      uVar3 = -uVar11;
      uVar11 = uVar11 >> 4;
      bVar9.container = (buffer<char> *)(uVar2 | (ulong)bVar9.container >> 4);
    } while (bVar19 || uVar3 < bVar18);
    pcVar7 = to_pointer<char>(&local_248.super_buffer<char>,n_00);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)((long)&local_2c8[0].prefix + sVar17);
      pcVar10 = "0123456789ABCDEF";
      if ((uVar6 >> 0xc & 1) == 0) {
        pcVar10 = "0123456789abcdef";
      }
      do {
        *pcVar7 = pcVar10[(uint)out.container & 0xf];
        pcVar7 = pcVar7 + -1;
        bVar18 = (buffer<char> *)0xf < out.container;
        bVar19 = uVar12 != 0;
        uVar11 = -uVar12;
        out.container = (buffer<char> *)(uVar12 << 0x3c | (ulong)out.container >> 4);
        uVar12 = uVar12 >> 4;
      } while (bVar19 || uVar11 < bVar18);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_2c8,(char *)((long)&local_2c8[0].prefix + sVar17 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar10 = "0123456789ABCDEF";
      if ((uVar6 >> 0xc & 1) == 0) {
        pcVar10 = "0123456789abcdef";
      }
      pcVar7 = pcVar7 + n_00;
      do {
        pcVar7 = pcVar7 + -1;
        uVar11 = uVar12 << 0x3c;
        *pcVar7 = pcVar10[(uint)out.container & 0xf];
        bVar18 = (out.container < (buffer<char> *)0x10) <= uVar12;
        uVar12 = uVar12 >> 4;
        out.container = (buffer<char> *)(uVar11 | (ulong)out.container >> 4);
      } while (bVar18);
    }
    break;
  case 5:
    uVar11 = uVar12;
    bVar9.container = out.container;
    n_00 = 0;
    do {
      sVar17 = n_00;
      uVar2 = uVar11 << 0x3d;
      n_00 = sVar17 + 1;
      bVar18 = (buffer<char> *)0x7 < bVar9.container;
      bVar19 = uVar11 != 0;
      uVar3 = -uVar11;
      uVar11 = uVar11 >> 3;
      bVar9.container = (buffer<char> *)(uVar2 | (ulong)bVar9.container >> 3);
    } while (bVar19 || uVar3 < bVar18);
    if (((uVar6 >> 0xd & 1) != 0) &&
       ((out.container != (buffer<char> *)0x0 || uVar12 != 0) &&
        *(int *)((long)&(grouping->grouping_)._M_string_length + 4) <= (int)n_00)) {
      uVar6 = 0x3000;
      if (uVar15 == 0) {
        uVar6 = 0x30;
      }
      uVar15 = (uVar6 | uVar15) + 0x1000000;
    }
    pcVar7 = to_pointer<char>(&local_248.super_buffer<char>,n_00);
    if (pcVar7 == (char *)0x0) {
      pbVar8 = (byte *)((long)&local_2c8[0].prefix + sVar17);
      do {
        *pbVar8 = (byte)out.container & 7 | 0x30;
        uVar11 = uVar12 << 0x3d;
        pbVar8 = pbVar8 + -1;
        bVar18 = (buffer<char> *)0x7 < out.container;
        bVar19 = uVar12 != 0;
        uVar2 = -uVar12;
        uVar12 = uVar12 >> 3;
        out.container = (buffer<char> *)(uVar11 | (ulong)out.container >> 3);
      } while (bVar19 || uVar2 < bVar18);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_2c8,(char *)((long)&local_2c8[0].prefix + sVar17 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pbVar8 = (byte *)(pcVar7 + n_00);
      do {
        pbVar8 = pbVar8 + -1;
        uVar11 = uVar12 << 0x3d;
        *pbVar8 = (byte)out.container & 7 | 0x30;
        bVar18 = (out.container < (buffer<char> *)0x8) <= uVar12;
        uVar12 = uVar12 >> 3;
        out.container = (buffer<char> *)(uVar11 | (ulong)out.container >> 3);
      } while (bVar18);
    }
    break;
  case 6:
    if ((uVar6 >> 0xd & 1) != 0) {
      uVar5 = (uint)((uVar6 >> 0xc & 1) == 0) << 0xd | 0x4230;
      uVar6 = uVar5 << 8;
      if (uVar15 == 0) {
        uVar6 = uVar5;
      }
      uVar15 = (uVar6 | uVar15) + 0x2000000;
    }
    uVar11 = uVar12;
    bVar9.container = out.container;
    n_00 = 0;
    do {
      sVar17 = n_00;
      uVar2 = uVar11 << 0x3f;
      n_00 = sVar17 + 1;
      bVar18 = (buffer<char> *)0x1 < bVar9.container;
      bVar19 = uVar11 != 0;
      uVar3 = -uVar11;
      uVar11 = uVar11 >> 1;
      bVar9.container = (buffer<char> *)(uVar2 | (ulong)bVar9.container >> 1);
    } while (bVar19 || uVar3 < bVar18);
    pcVar7 = to_pointer<char>(&local_248.super_buffer<char>,n_00);
    if (pcVar7 == (char *)0x0) {
      pbVar8 = (byte *)((long)&local_2c8[0].prefix + sVar17);
      do {
        *pbVar8 = (byte)out.container & 1 | 0x30;
        uVar11 = uVar12 << 0x3f;
        pbVar8 = pbVar8 + -1;
        bVar18 = (buffer<char> *)0x1 < out.container;
        bVar19 = uVar12 != 0;
        uVar2 = -uVar12;
        uVar12 = uVar12 >> 1;
        out.container = (buffer<char> *)(uVar11 | (ulong)out.container >> 1);
      } while (bVar19 || uVar2 < bVar18);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_2c8,(char *)((long)&local_2c8[0].prefix + sVar17 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pbVar8 = (byte *)(pcVar7 + n_00);
      do {
        pbVar8 = pbVar8 + -1;
        uVar11 = uVar12 << 0x3f;
        *pbVar8 = (byte)out.container & 1 | 0x30;
        bVar18 = (out.container < (buffer<char> *)0x2) <= uVar12;
        uVar12 = uVar12 >> 1;
        out.container = (buffer<char> *)(uVar11 | (ulong)out.container >> 1);
      } while (bVar18);
    }
    break;
  case 7:
    local_2c8[0].prefix._0_2_ = CONCAT11((char)out.container,(uVar6 & 7) == 1);
    bVar9 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      ((basic_appender<char>)this,(format_specs *)grouping,1,1,
                       (anon_class_2_2_bf5026b7 *)local_2c8);
    goto LAB_00479166;
  default:
    n._4_4_ = uVar15;
    n._0_4_ = in_stack_fffffffffffffd28;
    n._8_8_ = this;
    uVar6 = count_digits_fallback<unsigned__int128>((detail *)out.container,(unsigned___int128)n);
    n_00 = (size_t)uVar6;
    value_00._4_4_ = uVar15;
    value_00._0_4_ = in_stack_fffffffffffffd28;
    value_00._8_8_ = this;
    format_decimal<char,_unsigned___int128,_fmt::v11::basic_appender<char>,_0>
              ((detail *)&local_248,out,(unsigned___int128)value_00,prefix);
  }
  pbVar8 = (byte *)*in_R9;
  pbVar13 = pbVar8 + in_R9[1];
  uVar6 = ((uVar15 >> 0x18) + (int)n_00) - 1;
  iVar14 = 0;
  do {
    iVar16 = 0x7fffffff;
    if (in_R9[5] != 0) {
      if (pbVar8 == pbVar13) {
        uVar15 = (uint)(char)pbVar13[-1];
      }
      else {
        bVar1 = *pbVar8;
        if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_00479130;
        pbVar8 = pbVar8 + 1;
        uVar15 = (uint)bVar1;
      }
      iVar14 = iVar14 + uVar15;
      iVar16 = iVar14;
    }
LAB_00479130:
    uVar6 = uVar6 + 1;
  } while (iVar16 < (int)n_00);
  local_2c8[0].prefix = (uint *)&stack0xfffffffffffffd2c;
  local_2c8[0].buffer = &local_248;
  bVar9 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>(fmt::v11::basic_appender<char>,unsigned__int128,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    ((basic_appender<char>)this,(format_specs *)grouping,(ulong)uVar6,(ulong)uVar6,
                     local_2c8);
LAB_00479166:
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    free(local_248.super_buffer<char>.ptr_);
  }
  return (basic_appender<char>)bVar9.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_base2e<char>(4, appender(buffer), value, num_digits, specs.upper());
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt() && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_base2e<char>(3, appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_base2e<char>(1, appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}